

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmBitDxDy<(moira::Instr)27,(moira::Mode)0,1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *this_00;
  
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Tab)(str->tab).raw);
  StrWriter::operator<<(this_00,(Dn)((op & 0xe00) >> 9));
  StrWriter::operator<<(this_00);
  StrWriter::operator<<(this_00,(Dn)(op & 7));
  return;
}

Assistant:

void
Moira::dasmBitDxDy(StrWriter &str, u32 &addr, u16 op) const
{
    auto src = Dn       ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    str << Ins<I>{} << str.tab << src << Sep{} << dst;
}